

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:278:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:278:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr_untyped local_88;
  gc_heap_ptr_untyped local_78;
  undefined1 local_68 [32];
  gc_heap_ptr_untyped local_48;
  string_view local_38;
  string_view local_28;
  
  local_28._M_len = 8;
  local_28._M_str = "[object ";
  string::string((string *)(local_68 + 0x10),(this->f).h,&local_28);
  if (this_->type_ == object) {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(this_->field_1).s_);
    object::class_name((object *)local_68);
    operator+((mjs *)&local_48,(string *)(local_68 + 0x10),(string *)local_68);
    local_38._M_len = 1;
    local_38._M_str = "]";
    string::string((string *)&local_78,(this->f).h,&local_38);
    operator+((mjs *)&local_88,(string *)&local_48,(string *)&local_78);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_88.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_88.pos_;
    if (local_88.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_88.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_68 + 0x10));
    return __return_storage_ptr__;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }